

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

void __thiscall Array::Array(Array *this,string *name,attr *a)

{
  _Map_pointer ppiVar1;
  _Map_pointer ppiVar2;
  _Elt_pointer piVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  int local_2c;
  
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)this,0);
  (this->newName)._M_dataplus._M_p = (pointer)&(this->newName).field_2;
  (this->newName)._M_string_length = 0;
  (this->newName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->newName);
  for (; a->kind == 1; a = ((a->field_1).array)->type) {
    piVar9 = &((a->field_1).basic)->type;
    piVar3 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if (piVar3 == (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first) {
      std::deque<int,std::allocator<int>>::_M_push_front_aux<int_const&>
                ((deque<int,std::allocator<int>> *)this,piVar9);
    }
    else {
      piVar3[-1] = *piVar9;
      (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
      ._M_start._M_cur = piVar3 + -1;
    }
  }
  if (a->kind != 0) {
    std::operator<<((ostream *)&std::cerr,"Structure not implemented!\n");
    exit(1);
  }
  local_2c = 4;
  piVar3 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if (piVar3 == (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_first) {
    std::deque<int,_std::allocator<int>_>::_M_push_front_aux<int>(&this->directSize,&local_2c);
    piVar3 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  }
  else {
    piVar3[-1] = 4;
    piVar3 = piVar3 + -1;
    (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_start._M_cur = piVar3;
  }
  ppiVar1 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppiVar2 = (this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  uVar4 = (int)((ulong)((long)(this->directSize).super__Deque_base<int,_std::allocator<int>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_last - (long)piVar3) >> 2)
          + (int)((ulong)((long)(this->directSize).super__Deque_base<int,_std::allocator<int>_>.
                                _M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->directSize).super__Deque_base<int,_std::allocator<int>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_first) >> 2) +
          ((int)((ulong)((long)ppiVar1 - (long)ppiVar2) >> 3) + -1 +
          (uint)(ppiVar1 == (_Map_pointer)0x0)) * 0x80;
  if (1 < (int)uVar4) {
    lVar6 = (long)piVar3 -
            (long)(this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    uVar7 = lVar6 >> 2;
    lVar5 = (ulong)(uVar4 & 0x7fffffff) - 1;
    lVar8 = 1;
    do {
      if ((long)uVar7 < 0) {
        uVar10 = (long)uVar7 >> 7;
LAB_0010e8d6:
        piVar9 = (int *)((long)ppiVar2[uVar10] + lVar6 + uVar10 * -0x200);
      }
      else {
        if (0x7f < uVar7) {
          uVar10 = uVar7 >> 7;
          goto LAB_0010e8d6;
        }
        piVar9 = piVar3 + lVar8 + -1;
      }
      uVar7 = uVar7 + 1;
      if ((long)uVar7 < 0) {
        uVar10 = (long)uVar7 >> 7;
LAB_0010e905:
        piVar11 = (int *)((long)ppiVar2[uVar10] + lVar6 + uVar10 * -0x200 + 4);
      }
      else {
        if (0x7f < uVar7) {
          uVar10 = uVar7 >> 7;
          goto LAB_0010e905;
        }
        piVar11 = piVar3 + lVar8;
      }
      *piVar11 = *piVar9 * *piVar11;
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 4;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

Array(const string &name, attr *a) {
        newName = name;
        while (a->kind == ARRAY) {
            directSize.push_front(a->array->size);
            a = a->array->type;
        }
        if (a->kind == BASIC) directSize.push_front(4);
        else { /* TODO Struct */
            IMP_ME("Structure");
        }
        for (int i = 1; i < (int)directSize.size(); ++i)
            directSize[i] *= directSize[i - 1];
    }